

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalForcesContIntDamping
          (ChElementBeamANCF_3333 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_1,__1,__1> *a_lhs;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 (*pauVar5) [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  Index index;
  void *pvVar60;
  ulong uVar61;
  long lVar62;
  undefined8 *puVar63;
  double *pdVar64;
  char *pcVar65;
  double *pdVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  double dVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  double dVar107;
  double dVar108;
  double dVar109;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  double dVar125;
  undefined1 auVar128 [32];
  double dVar129;
  double dVar132;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  double dVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  VectorNIP_D0 E_BlockDamping_D0;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  undefined1 local_1800 [40];
  double dStack_17d8;
  double dStack_17d0;
  double dStack_17c8;
  double local_17c0;
  double dStack_17b8;
  double dStack_17b0;
  double dStack_17a8;
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  double local_1760;
  double dStack_1758;
  double dStack_1750;
  double dStack_1748;
  double local_1740;
  double dStack_1738;
  double dStack_1730;
  double dStack_1728;
  undefined1 local_1720 [16];
  undefined1 auStack_1710 [16];
  double local_1700;
  double dStack_16f8;
  double dStack_16f0;
  double dStack_16e8;
  double local_16e0;
  double dStack_16d8;
  double dStack_16d0;
  double dStack_16c8;
  undefined1 local_16c0 [16];
  double dStack_16b0;
  double dStack_16a8;
  double local_16a0;
  double dStack_1698;
  double dStack_1690;
  double dStack_1688;
  double local_1680;
  double dStack_1678;
  double dStack_1670;
  double dStack_1668;
  double local_1660;
  double dStack_1658;
  double dStack_1650;
  double dStack_1648;
  undefined1 local_1640 [32];
  Scalar local_1608;
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  double local_1560;
  double dStack_1558;
  double dStack_1550;
  double dStack_1548;
  double local_1540;
  double dStack_1538;
  double dStack_1530;
  double dStack_1528;
  undefined1 local_1520 [32];
  double local_1500;
  double dStack_14f8;
  double dStack_14f0;
  double dStack_14e8;
  double local_14e0;
  double dStack_14d8;
  double dStack_14d0;
  double dStack_14c8;
  double local_14c0;
  double dStack_14b8;
  double dStack_14b0;
  double dStack_14a8;
  double local_14a0;
  double dStack_1498;
  double dStack_1490;
  double dStack_1488;
  double local_1480;
  double dStack_1478;
  double dStack_1470;
  double dStack_1468;
  double local_1460;
  double dStack_1458;
  double dStack_1450;
  double dStack_1448;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [16];
  double dStack_1390;
  double dStack_1388;
  double local_1380;
  double dStack_1378;
  double dStack_1370;
  double dStack_1368;
  undefined1 local_1360 [32];
  undefined1 local_1340 [16];
  double dStack_1330;
  double dStack_1328;
  undefined1 local_1320 [16];
  double dStack_1310;
  double dStack_1308;
  double local_1300;
  double dStack_12f8;
  double dStack_12f0;
  double dStack_12e8;
  double local_12e0;
  double dStack_12d8;
  double dStack_12d0;
  double dStack_12c8;
  double local_12c0;
  double dStack_12b8;
  double dStack_12b0;
  double dStack_12a8;
  double local_12a0;
  double dStack_1298;
  double dStack_1290;
  double dStack_1288;
  double local_1280;
  double dStack_1278;
  double dStack_1270;
  double dStack_1268;
  double local_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double local_1240;
  double dStack_1238;
  double dStack_1230;
  double dStack_1228;
  double local_1220;
  double dStack_1218;
  double dStack_1210;
  double dStack_1208;
  double local_1200;
  double dStack_11f8;
  double dStack_11f0;
  double dStack_11e8;
  double local_11e0;
  double dStack_11d8;
  double dStack_11d0;
  double dStack_11c8;
  double local_11c0;
  double dStack_11b8;
  double dStack_11b0;
  double dStack_11a8;
  double local_11a0;
  double dStack_1198;
  double dStack_1190;
  double dStack_1188;
  double local_1180;
  double dStack_1178;
  double dStack_1170;
  double dStack_1168;
  double local_1160;
  double dStack_1158;
  double dStack_1150;
  double dStack_1148;
  double local_1140;
  double dStack_1138;
  double dStack_1130;
  double dStack_1128;
  double local_1120;
  double dStack_1118;
  double dStack_1110;
  double dStack_1108;
  double local_1100;
  double dStack_10f8;
  double dStack_10f0;
  double dStack_10e8;
  double local_10e0;
  double dStack_10d8;
  double dStack_10d0;
  double dStack_10c8;
  double local_10c0;
  double dStack_10b8;
  double dStack_10b0;
  double dStack_10a8;
  double local_10a0;
  double dStack_1098;
  double dStack_1090;
  double dStack_1088;
  double local_1080;
  double dStack_1078;
  double dStack_1070;
  double dStack_1068;
  double local_1060;
  double dStack_1058;
  double dStack_1050;
  double dStack_1048;
  double local_1040;
  double dStack_1038;
  double dStack_1030;
  double dStack_1028;
  double local_1020;
  double dStack_1018;
  double dStack_1010;
  double dStack_1008;
  Matrix<double,_45,_3,_0,_45,_3> local_ff0;
  undefined1 local_bb0 [128];
  double local_b30;
  double dStack_b28;
  double dStack_b20;
  double dStack_b18;
  undefined1 local_b10 [32];
  undefined1 local_af0 [32];
  undefined1 local_ad0 [32];
  undefined1 local_ab0 [32];
  double local_a90;
  double dStack_a88;
  double local_a80;
  double local_a78;
  double dStack_a70;
  double local_a68;
  double local_a60;
  double dStack_a58;
  double local_a50;
  double local_a48;
  double dStack_a40;
  double dStack_a38;
  double dStack_a30;
  double local_a28;
  double dStack_a20;
  double dStack_a18;
  double dStack_a10;
  double local_a08;
  double dStack_a00;
  double dStack_9f8;
  double dStack_9f0;
  double local_9e8;
  double dStack_9e0;
  double dStack_9d8;
  double dStack_9d0;
  double local_9c8;
  double dStack_9c0;
  double dStack_9b8;
  double dStack_9b0;
  double local_9a8;
  double dStack_9a0;
  double dStack_998;
  double dStack_990;
  undefined1 local_988 [32];
  undefined1 local_968 [32];
  undefined1 local_948 [32];
  double local_928;
  double dStack_920;
  double local_918;
  double local_910;
  double dStack_908;
  double local_900;
  double local_8f8;
  double dStack_8f0;
  double local_8e8;
  double local_8e0;
  double dStack_8d8;
  double dStack_8d0;
  double dStack_8c8;
  double local_8c0;
  double dStack_8b8;
  double dStack_8b0;
  double dStack_8a8;
  double local_8a0;
  double dStack_898;
  double dStack_890;
  double dStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  double local_7c0;
  double dStack_7b8;
  double local_7b0;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double local_790;
  double dStack_788;
  double local_780;
  double local_778;
  double dStack_770;
  double dStack_768;
  double dStack_760;
  double local_758;
  double dStack_750;
  double dStack_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  double dStack_728;
  double dStack_720;
  undefined1 local_718 [32];
  double local_6f8;
  double dStack_6f0;
  double dStack_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double dStack_6c8;
  double dStack_6c0;
  undefined1 local_6b8 [32];
  undefined1 local_698 [32];
  double local_678;
  double dStack_670;
  double dStack_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  double local_640;
  double dStack_638;
  double local_630;
  double local_628;
  double dStack_620;
  double local_618;
  double local_610;
  double dStack_608;
  double dStack_600;
  double dStack_5f8;
  double local_5f0;
  double dStack_5e8;
  double dStack_5e0;
  double dStack_5d8;
  double local_5d0;
  double dStack_5c8;
  double dStack_5c0;
  double dStack_5b8;
  double local_5b0;
  double dStack_5a8;
  double dStack_5a0;
  double dStack_598;
  double local_590;
  double dStack_588;
  double dStack_580;
  double dStack_578;
  double local_570;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  undefined1 local_550 [32];
  undefined1 local_530 [32];
  undefined1 local_510 [32];
  double local_4f0;
  double dStack_4e8;
  double local_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double local_4c0;
  double dStack_4b8;
  double local_4b0;
  double local_4a8;
  double dStack_4a0;
  double dStack_498;
  double dStack_490;
  double local_488;
  double dStack_480;
  double dStack_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double dStack_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double dStack_438;
  double dStack_430;
  undefined1 local_428 [32];
  undefined1 local_408 [32];
  double local_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double dStack_3b8;
  double dStack_3b0;
  undefined1 local_3a8 [32];
  double local_388;
  double dStack_380;
  double local_378;
  double local_370;
  double dStack_368;
  double local_360;
  double local_358;
  double dStack_350;
  double local_348;
  Matrix<double,_9,_3,_1,_9,_3> local_340;
  MatrixNx6 local_230;
  
  CalcCombinedCoordMatrix(this,&local_230);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 9) {
    pcVar65 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 9, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 9, 6, 1>, Option = 0]"
    ;
LAB_0071cc02:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar65);
  }
  a_lhs = &this->m_SD;
  local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[0]
       = (double)a_lhs;
  local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[1]
       = (double)&local_230;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      == 0x2d) {
    memset((Matrix<double,_45,_6,_0,_45,_6> *)local_bb0,0,0x870);
    local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.array[0]
         = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,9,6,1,9,6>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,45,6,0,45,6>>
              ((Matrix<double,_45,_6,_0,_45,_6> *)local_bb0,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_ff0,&local_230,
               (Scalar *)&local_340);
    peVar3 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
    [1] = (double)local_1800;
    local_1060 = local_778;
    dStack_1058 = dStack_770;
    dStack_1050 = dStack_768;
    dStack_1048 = dStack_760;
    local_10a0 = local_610;
    dStack_1098 = dStack_608;
    dStack_1090 = dStack_600;
    dStack_1088 = dStack_5f8;
    local_1100 = local_4a8;
    dStack_10f8 = dStack_4a0;
    dStack_10f0 = dStack_498;
    dStack_10e8 = dStack_490;
    local_1800._0_8_ =
         (double)local_bb0._0_8_ * local_778 + local_a48 * local_610 + local_8e0 * local_4a8;
    local_1800._8_8_ =
         (double)local_bb0._8_8_ * dStack_770 + dStack_a40 * dStack_608 + dStack_8d8 * dStack_4a0;
    local_1800._16_8_ =
         (double)local_bb0._16_8_ * dStack_768 + dStack_a38 * dStack_600 + dStack_8d0 * dStack_498;
    local_1800._24_8_ =
         (double)local_bb0._24_8_ * dStack_760 + dStack_a30 * dStack_5f8 + dStack_8c8 * dStack_490;
    local_10c0 = local_5f0;
    dStack_10b8 = dStack_5e8;
    dStack_10b0 = dStack_5e0;
    dStack_10a8 = dStack_5d8;
    local_1040 = local_758;
    dStack_1038 = dStack_750;
    dStack_1030 = dStack_748;
    dStack_1028 = dStack_740;
    local_1120 = local_488;
    dStack_1118 = dStack_480;
    dStack_1110 = dStack_478;
    dStack_1108 = dStack_470;
    dStack_17d8 = (double)local_bb0._40_8_ * dStack_750 + dStack_a20 * dStack_5e8 +
                  dStack_8b8 * dStack_480;
    local_1800._32_8_ =
         (double)local_bb0._32_8_ * local_758 + local_a28 * local_5f0 + local_8c0 * local_488;
    dStack_17d0 = (double)local_bb0._48_8_ * dStack_748 + dStack_a18 * dStack_5e0 +
                  dStack_8b0 * dStack_478;
    dStack_17c8 = (double)local_bb0._56_8_ * dStack_740 + dStack_a10 * dStack_5d8 +
                  dStack_8a8 * dStack_470;
    local_1080 = local_5d0;
    dStack_1078 = dStack_5c8;
    dStack_1070 = dStack_5c0;
    dStack_1068 = dStack_5b8;
    local_1020 = local_738;
    dStack_1018 = dStack_730;
    dStack_1010 = dStack_728;
    dStack_1008 = dStack_720;
    local_10e0 = local_468;
    dStack_10d8 = dStack_460;
    dStack_10d0 = dStack_458;
    dStack_10c8 = dStack_450;
    dStack_17b8 = (double)local_bb0._72_8_ * dStack_730 + dStack_a00 * dStack_5c8 +
                  dStack_898 * dStack_460;
    local_17c0 = (double)local_bb0._64_8_ * local_738 + local_a08 * local_5d0 +
                 local_8a0 * local_468;
    dStack_17b0 = (double)local_bb0._80_8_ * dStack_728 + dStack_9f8 * dStack_5c0 +
                  dStack_890 * dStack_458;
    dStack_17a8 = (double)local_bb0._88_8_ * dStack_720 + dStack_9f0 * dStack_5b8 +
                  dStack_888 * dStack_450;
    dVar125 = this->m_Alpha;
    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
    [0] = dVar125 + dVar125;
    if (((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_rows == 0xc) &&
       ((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols == 1)) {
      auVar68._8_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[1];
      auVar68._0_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      local_1260 = (double)local_bb0._64_8_;
      dStack_1258 = (double)local_bb0._72_8_;
      dStack_1250 = (double)local_bb0._80_8_;
      dStack_1248 = (double)local_bb0._88_8_;
      local_14a0 = local_a08;
      dStack_1498 = dStack_a00;
      dStack_1490 = dStack_9f8;
      dStack_1488 = dStack_9f0;
      local_16e0 = local_8a0;
      dStack_16d8 = dStack_898;
      dStack_16d0 = dStack_890;
      dStack_16c8 = dStack_888;
      local_14c0 = local_a28;
      dStack_14b8 = dStack_a20;
      dStack_14b0 = dStack_a18;
      dStack_14a8 = dStack_a10;
      local_14e0 = local_8c0;
      dStack_14d8 = dStack_8b8;
      dStack_14d0 = dStack_8b0;
      dStack_14c8 = dStack_8a8;
      pdVar64 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_12e0 = local_8e0;
      dStack_12d8 = dStack_8d8;
      dStack_12d0 = dStack_8d0;
      dStack_12c8 = dStack_8c8;
      local_1380 = local_a48;
      dStack_1378 = dStack_a40;
      dStack_1370 = dStack_a38;
      dStack_1368 = dStack_a30;
      local_1540 = (double)local_bb0._0_8_;
      dStack_1538 = (double)local_bb0._8_8_;
      dStack_1530 = (double)local_bb0._16_8_;
      dStack_1528 = (double)local_bb0._24_8_;
      local_1700 = (double)local_bb0._32_8_;
      dStack_16f8 = (double)local_bb0._40_8_;
      dStack_16f0 = (double)local_bb0._48_8_;
      dStack_16e8 = (double)local_bb0._56_8_;
      pdVar66 = (double *)vpextrq_avx(auVar68,1);
      _local_13a0 = local_718;
      auVar57 = _local_13a0;
      _local_1320 = local_428;
      auVar59 = _local_1320;
      local_1300 = local_448;
      dStack_12f8 = dStack_440;
      dStack_12f0 = dStack_438;
      dStack_12e8 = dStack_430;
      _local_1340 = local_408;
      auVar58 = _local_1340;
      dStack_1128 = (peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[0] * 0.5;
      local_1760 = local_9e8;
      dStack_1758 = dStack_9e0;
      dStack_1750 = dStack_9d8;
      dStack_1748 = dStack_9d0;
      local_1180 = ((double)local_bb0._0_8_ * (double)local_bb0._0_8_ + local_a48 * local_a48 +
                    local_8e0 * local_8e0 + -1.0 +
                   local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] * *pdVar66) * *pdVar64 * dStack_1128;
      dStack_1178 = ((double)local_bb0._8_8_ * (double)local_bb0._8_8_ + dStack_a40 * dStack_a40 +
                     dStack_8d8 * dStack_8d8 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[1]) * pdVar64[1] * dStack_1128;
      dStack_1170 = ((double)local_bb0._16_8_ * (double)local_bb0._16_8_ + dStack_a38 * dStack_a38 +
                     dStack_8d0 * dStack_8d0 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[2]) * pdVar64[2] * dStack_1128;
      dStack_1168 = ((double)local_bb0._24_8_ * (double)local_bb0._24_8_ + dStack_a30 * dStack_a30 +
                     dStack_8c8 * dStack_8c8 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[3]) * pdVar64[3] * dStack_1128;
      local_1160 = ((double)local_bb0._32_8_ * (double)local_bb0._32_8_ + local_a28 * local_a28 +
                    local_8c0 * local_8c0 + -1.0 +
                   local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] * pdVar66[4]) * pdVar64[4] * dStack_1128;
      dStack_1158 = ((double)local_bb0._40_8_ * (double)local_bb0._40_8_ + dStack_a20 * dStack_a20 +
                     dStack_8b8 * dStack_8b8 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[5]) * pdVar64[5] * dStack_1128;
      dStack_1150 = ((double)local_bb0._48_8_ * (double)local_bb0._48_8_ + dStack_a18 * dStack_a18 +
                     dStack_8b0 * dStack_8b0 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[6]) * pdVar64[6] * dStack_1128;
      dStack_1148 = ((double)local_bb0._56_8_ * (double)local_bb0._56_8_ + dStack_a10 * dStack_a10 +
                     dStack_8a8 * dStack_8a8 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[7]) * pdVar64[7] * dStack_1128;
      local_1140 = ((double)local_bb0._64_8_ * (double)local_bb0._64_8_ + local_a08 * local_a08 +
                    local_8a0 * local_8a0 + -1.0 +
                   local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] * pdVar66[8]) * pdVar64[8] * dStack_1128;
      dStack_1138 = ((double)local_bb0._72_8_ * (double)local_bb0._72_8_ + dStack_a00 * dStack_a00 +
                     dStack_898 * dStack_898 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[9]) * pdVar64[9] * dStack_1128;
      dStack_1130 = ((double)local_bb0._80_8_ * (double)local_bb0._80_8_ + dStack_9f8 * dStack_9f8 +
                     dStack_890 * dStack_890 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[10]) * pdVar64[10] * dStack_1128;
      dStack_1128 = ((double)local_bb0._88_8_ * (double)local_bb0._88_8_ + dStack_9f0 * dStack_9f0 +
                     dStack_888 * dStack_888 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar66[0xb]) * pdVar64[0xb] * dStack_1128;
      auVar77 = vmulpd_avx512vl(local_bb0._96_32_,local_718);
      local_1780 = local_bb0._96_32_;
      local_1680 = local_5b0;
      dStack_1678 = dStack_5a8;
      dStack_1670 = dStack_5a0;
      dStack_1668 = dStack_598;
      dVar129 = local_880._0_8_;
      dVar7 = local_880._8_8_;
      dVar12 = local_880._16_8_;
      dVar19 = local_880._24_8_;
      local_15c0 = local_880;
      local_1560 = local_9c8;
      dStack_1558 = dStack_9c0;
      dStack_1550 = dStack_9b8;
      dStack_1548 = dStack_9b0;
      local_1740 = local_b30;
      dStack_1738 = dStack_b28;
      dStack_1730 = dStack_b20;
      dStack_1728 = dStack_b18;
      local_16a0 = local_6f8;
      dStack_1698 = dStack_6f0;
      dStack_1690 = dStack_6e8;
      dStack_1688 = dStack_6e0;
      local_1460 = local_590;
      dStack_1458 = dStack_588;
      dStack_1450 = dStack_580;
      dStack_1448 = dStack_578;
      auVar78 = vmulpd_avx512vl(local_860,local_428);
      _local_1720 = local_860;
      auVar56 = _local_1720;
      local_1500 = local_9a8;
      dStack_14f8 = dStack_9a0;
      dStack_14f0 = dStack_998;
      dStack_14e8 = dStack_990;
      local_1520 = local_b10;
      local_1660 = local_6d8;
      dStack_1658 = dStack_6d0;
      dStack_1650 = dStack_6c8;
      dStack_1648 = dStack_6c0;
      local_1480 = local_570;
      dStack_1478 = dStack_568;
      dStack_1470 = dStack_560;
      dStack_1468 = dStack_558;
      auVar79 = vmulpd_avx512vl(local_840,local_408);
      local_17a0 = local_840;
      dVar132 = local_bb0._96_8_;
      dVar8 = local_bb0._104_8_;
      dVar13 = local_bb0._112_8_;
      dVar20 = local_bb0._120_8_;
      auVar80 = vmulpd_avx512vl(local_880,local_880);
      auVar81 = vmulpd_avx512vl(local_860,local_860);
      auVar82 = vmulpd_avx512vl(local_948,local_948);
      local_1400 = local_948;
      auVar83 = vmulpd_avx512vl(local_b10,local_b10);
      dVar133 = local_840._0_8_;
      dVar9 = local_840._8_8_;
      dVar14 = local_840._16_8_;
      dVar21 = local_840._24_8_;
      dStack_11a8 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 8) * 0.5;
      auVar84 = vmulpd_avx512vl(local_948,local_510);
      local_11e0 = (dVar132 * dVar132 + local_9e8 * local_9e8 + auVar80._0_8_ + -1.0 +
                   local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (auVar77._0_8_ + local_9e8 * local_5b0 + local_448 * dVar129)) * *pdVar64 *
                   dStack_11a8;
      dStack_11d8 = (dVar8 * dVar8 + dStack_9e0 * dStack_9e0 + auVar80._8_8_ + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar77._8_8_ + dStack_9e0 * dStack_5a8 + dStack_440 * dVar7)) * pdVar64[1] *
                    dStack_11a8;
      dStack_11d0 = (dVar13 * dVar13 + dStack_9d8 * dStack_9d8 + auVar80._16_8_ + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar77._16_8_ + dStack_9d8 * dStack_5a0 + dStack_438 * dVar12)) * pdVar64[2] *
                    dStack_11a8;
      dStack_11c8 = (dVar20 * dVar20 + dStack_9d0 * dStack_9d0 + auVar80._24_8_ + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar77._24_8_ + dStack_9d0 * dStack_598 + dStack_430 * dVar19)) * pdVar64[3] *
                    dStack_11a8;
      local_11a0 = (auVar83._0_8_ + local_9a8 * local_9a8 + dVar133 * dVar133 + -1.0 +
                   local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (local_b10._0_8_ * local_6d8 + local_9a8 * local_570 + auVar79._0_8_)) *
                   pdVar64[8] * dStack_11a8;
      dStack_1198 = (auVar83._8_8_ + dStack_9a0 * dStack_9a0 + dVar9 * dVar9 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (local_b10._8_8_ * dStack_6d0 + dStack_9a0 * dStack_568 + auVar79._8_8_)) *
                    pdVar64[9] * dStack_11a8;
      dStack_1190 = (auVar83._16_8_ + dStack_998 * dStack_998 + dVar14 * dVar14 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (local_b10._16_8_ * dStack_6c8 + dStack_998 * dStack_560 + auVar79._16_8_)) *
                    pdVar64[10] * dStack_11a8;
      dStack_1188 = (auVar83._24_8_ + dStack_990 * dStack_990 + dVar21 * dVar21 + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (local_b10._24_8_ * dStack_6c0 + dStack_990 * dStack_558 + auVar79._24_8_)) *
                    pdVar64[0xb] * dStack_11a8;
      local_11c0 = (local_b30 * local_b30 + local_9c8 * local_9c8 + auVar81._0_8_ + -1.0 +
                   local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (local_b30 * local_6f8 + local_9c8 * local_590 + auVar78._0_8_)) * pdVar64[4] *
                   dStack_11a8;
      dStack_11b8 = (dStack_b28 * dStack_b28 + dStack_9c0 * dStack_9c0 + auVar81._8_8_ + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (dStack_b28 * dStack_6f0 + dStack_9c0 * dStack_588 + auVar78._8_8_)) *
                    pdVar64[5] * dStack_11a8;
      dStack_11b0 = (dStack_b20 * dStack_b20 + dStack_9b8 * dStack_9b8 + auVar81._16_8_ + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (dStack_b20 * dStack_6e8 + dStack_9b8 * dStack_580 + auVar78._16_8_)) *
                    pdVar64[6] * dStack_11a8;
      dStack_11a8 = (dStack_b18 * dStack_b18 + dStack_9b0 * dStack_9b0 + auVar81._24_8_ + -1.0 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (dStack_b18 * dStack_6e0 + dStack_9b0 * dStack_578 + auVar78._24_8_)) *
                    pdVar64[7] * dStack_11a8;
      auVar78 = vmulpd_avx512vl(local_af0,local_6b8);
      local_1600 = local_af0;
      dVar101 = local_988._0_8_;
      dVar107 = local_988._8_8_;
      dVar108 = local_988._16_8_;
      dVar109 = local_988._24_8_;
      auVar77 = vmulpd_avx512vl(local_988,local_988);
      local_15a0 = local_988;
      dVar119 = local_820._0_8_;
      dVar10 = local_820._8_8_;
      dVar15 = local_820._16_8_;
      dVar22 = local_820._24_8_;
      auVar79 = vmulpd_avx512vl(local_968,local_530);
      local_1580 = local_968;
      local_15e0 = local_ad0;
      auVar100._0_8_ = local_ad0._0_8_ * local_698._0_8_ + auVar79._0_8_;
      auVar100._8_8_ = local_ad0._8_8_ * local_698._8_8_ + auVar79._8_8_;
      auVar100._16_8_ = local_ad0._16_8_ * local_698._16_8_ + auVar79._16_8_;
      auVar100._24_8_ = local_ad0._24_8_ * local_698._24_8_ + auVar79._24_8_;
      dVar6 = local_800._0_8_;
      auVar114._0_8_ = local_3c8 * dVar6;
      dVar11 = local_800._8_8_;
      auVar114._8_8_ = dStack_3c0 * dVar11;
      dVar16 = local_800._16_8_;
      auVar114._16_8_ = dStack_3b8 * dVar16;
      dVar23 = local_800._24_8_;
      auVar114._24_8_ = dStack_3b0 * dVar23;
      auVar79 = vaddpd_avx512vl(auVar100,auVar114);
      auVar124._0_8_ = local_ab0._0_8_ * local_678;
      auVar124._8_8_ = local_ab0._8_8_ * dStack_670;
      auVar124._16_8_ = local_ab0._16_8_ * dStack_668;
      auVar124._24_8_ = local_ab0._24_8_ * dStack_660;
      auVar80 = vmulpd_avx512vl(local_7e0,local_3a8);
      auVar81 = vmulpd_avx512vl(local_968,local_968);
      local_1420 = local_ab0;
      auVar83 = vaddpd_avx512vl(auVar124,auVar84);
      auVar80 = vaddpd_avx512vl(auVar83,auVar80);
      auVar83 = vmulpd_avx512vl(local_af0,local_af0);
      auVar77 = vaddpd_avx512vl(auVar83,auVar77);
      auVar83 = vmulpd_avx512vl(local_820,local_820);
      auVar77 = vaddpd_avx512vl(auVar77,auVar83);
      auVar83 = vmulpd_avx512vl(local_ad0,local_ad0);
      auVar81 = vaddpd_avx512vl(auVar83,auVar81);
      auVar83 = vmulpd_avx512vl(local_800,local_800);
      auVar128._0_8_ = auVar77._0_8_ + -1.0;
      auVar128._8_8_ = auVar77._8_8_ + -1.0;
      auVar128._16_8_ = auVar77._16_8_ + -1.0;
      auVar128._24_8_ = auVar77._24_8_ + -1.0;
      auVar77 = vaddpd_avx512vl(auVar81,auVar83);
      auVar81 = vmulpd_avx512vl(local_ab0,local_ab0);
      auVar81 = vaddpd_avx512vl(auVar81,auVar82);
      auVar82 = vmulpd_avx512vl(local_7e0,local_7e0);
      auVar104._0_8_ = auVar77._0_8_ + -1.0;
      auVar104._8_8_ = auVar77._8_8_ + -1.0;
      auVar104._16_8_ = auVar77._16_8_ + -1.0;
      auVar104._24_8_ = auVar77._24_8_ + -1.0;
      auVar81 = vaddpd_avx512vl(auVar81,auVar82);
      auVar130._8_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar130._0_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar130._16_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar130._24_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar77._8_8_ = auVar78._8_8_ + dVar107 * local_550._8_8_ + dStack_3e0 * dVar10;
      auVar77._0_8_ = auVar78._0_8_ + dVar101 * local_550._0_8_ + local_3e8 * dVar119;
      auVar77._16_8_ = auVar78._16_8_ + dVar108 * local_550._16_8_ + dStack_3d8 * dVar15;
      auVar77._24_8_ = auVar78._24_8_ + dVar109 * local_550._24_8_ + dStack_3d0 * dVar22;
      auVar77 = vmulpd_avx512vl(auVar130,auVar77);
      auVar78 = vmulpd_avx512vl(auVar130,auVar79);
      auVar80 = vmulpd_avx512vl(auVar130,auVar80);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar125;
      dStack_11e8 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x10) * 0.5;
      auVar78 = vaddpd_avx512vl(auVar104,auVar78);
      auVar77 = vaddpd_avx512vl(auVar128,auVar77);
      auVar79._8_8_ = dStack_9e0;
      auVar79._0_8_ = local_9e8;
      auVar79._16_8_ = dStack_9d8;
      auVar79._24_8_ = dStack_9d0;
      vmovsd_avx512f(auVar67);
      local_1220 = dStack_11e8 * auVar78._0_8_ * pdVar64[4];
      dStack_1218 = dStack_11e8 * auVar78._8_8_ * pdVar64[5];
      dStack_1210 = dStack_11e8 * auVar78._16_8_ * pdVar64[6];
      dStack_1208 = dStack_11e8 * auVar78._24_8_ * pdVar64[7];
      local_1240 = auVar77._0_8_ * *pdVar64 * dStack_11e8;
      dStack_1238 = auVar77._8_8_ * pdVar64[1] * dStack_11e8;
      dStack_1230 = auVar77._16_8_ * pdVar64[2] * dStack_11e8;
      dStack_1228 = auVar77._24_8_ * pdVar64[3] * dStack_11e8;
      local_1200 = dStack_11e8 * (auVar80._0_8_ + auVar81._0_8_ + -1.0) * pdVar64[8];
      dStack_11f8 = dStack_11e8 * (auVar80._8_8_ + auVar81._8_8_ + -1.0) * pdVar64[9];
      dStack_11f0 = dStack_11e8 * (auVar80._16_8_ + auVar81._16_8_ + -1.0) * pdVar64[10];
      dStack_11e8 = dStack_11e8 * (auVar80._24_8_ + auVar81._24_8_ + -1.0) * pdVar64[0xb];
      auVar91._8_8_ = dStack_5a8;
      auVar91._0_8_ = local_5b0;
      auVar91._16_8_ = dStack_5a0;
      auVar91._24_8_ = dStack_598;
      auVar77 = vmulpd_avx512vl(local_988,auVar91);
      local_1720._0_8_ = local_860._0_8_;
      local_1720._8_8_ = local_860._8_8_;
      auStack_1710._0_8_ = local_860._16_8_;
      auStack_1710._8_8_ = local_860._24_8_;
      auVar80 = vmulpd_avx512vl(local_718,local_af0);
      auVar94._8_8_ = dStack_9c0;
      auVar94._0_8_ = local_9c8;
      auVar94._16_8_ = dStack_9b8;
      auVar94._24_8_ = dStack_9b0;
      auVar81 = vmulpd_avx512vl(local_bb0._96_32_,local_6b8);
      auVar83 = vmulpd_avx512vl(auVar79,local_550);
      auVar32._8_8_ = dStack_588;
      auVar32._0_8_ = local_590;
      auVar32._16_8_ = dStack_580;
      auVar32._24_8_ = dStack_578;
      auVar78 = vmulpd_avx512vl(local_968,auVar32);
      auVar89._8_8_ = dStack_6f0;
      auVar89._0_8_ = local_6f8;
      auVar89._16_8_ = dStack_6e8;
      auVar89._24_8_ = dStack_6e0;
      auVar84 = vmulpd_avx512vl(local_ad0,auVar89);
      auVar85 = vmulpd_avx512vl(local_428,local_800);
      auVar82._8_8_ = dStack_b28;
      auVar82._0_8_ = local_b30;
      auVar82._16_8_ = dStack_b20;
      auVar82._24_8_ = dStack_b18;
      auVar86 = vmulpd_avx512vl(auVar82,local_698);
      auVar87 = vmulpd_avx512vl(auVar94,local_530);
      auVar31._8_8_ = dStack_568;
      auVar31._0_8_ = local_570;
      auVar31._16_8_ = dStack_560;
      auVar31._24_8_ = dStack_558;
      auVar88 = vmulpd_avx512vl(local_948,auVar31);
      dStack_17d8 = (double)local_1720._8_8_ * dStack_3c0 +
                    auVar87._8_8_ + auVar86._8_8_ + auVar84._8_8_ + auVar78._8_8_ + auVar85._8_8_;
      local_1800._32_8_ =
           (double)local_1720._0_8_ * local_3c8 +
           auVar87._0_8_ + auVar86._0_8_ + auVar84._0_8_ + auVar78._0_8_ + auVar85._0_8_;
      dStack_17d0 = (double)auStack_1710._0_8_ * dStack_3b8 +
                    auVar87._16_8_ +
                    auVar86._16_8_ + auVar84._16_8_ + auVar78._16_8_ + auVar85._16_8_;
      dStack_17c8 = (double)auStack_1710._8_8_ * dStack_3b0 +
                    auVar87._24_8_ +
                    auVar86._24_8_ + auVar84._24_8_ + auVar78._24_8_ + auVar85._24_8_;
      auVar92._8_8_ = dStack_6d0;
      auVar92._0_8_ = local_6d8;
      auVar92._16_8_ = dStack_6c8;
      auVar92._24_8_ = dStack_6c0;
      auVar84 = vmulpd_avx512vl(local_ab0,auVar92);
      auVar85 = vmulpd_avx512vl(local_408,local_7e0);
      auVar48._8_8_ = dStack_4a0;
      auVar48._0_8_ = local_4a8;
      auVar48._16_8_ = dStack_498;
      auVar48._24_8_ = dStack_490;
      local_13e0 = local_820;
      auVar98._8_8_ = dStack_9a0;
      auVar98._0_8_ = local_9a8;
      auVar98._16_8_ = dStack_998;
      auVar98._24_8_ = dStack_990;
      local_1360 = local_7e0;
      auVar86 = vmulpd_avx512vl(local_840,local_3a8);
      auVar78 = vmulpd_avx512vl(auVar79,local_988);
      auVar79 = vmulpd_avx512vl(local_bb0._96_32_,local_af0);
      local_13c0 = local_800;
      auVar87 = vmulpd_avx512vl(auVar94,local_968);
      auVar51._8_8_ = dStack_608;
      auVar51._0_8_ = local_610;
      auVar51._16_8_ = dStack_600;
      auVar51._24_8_ = dStack_5f8;
      auVar96._8_8_ = local_bb0._8_8_;
      auVar96._0_8_ = local_bb0._0_8_;
      auVar96._16_8_ = local_bb0._16_8_;
      auVar96._24_8_ = local_bb0._24_8_;
      auVar105._0_8_ = auVar79._0_8_ + auVar78._0_8_ + dVar129 * dVar119;
      auVar105._8_8_ = auVar79._8_8_ + auVar78._8_8_ + dVar7 * dVar10;
      auVar105._16_8_ = auVar79._16_8_ + auVar78._16_8_ + dVar12 * dVar15;
      auVar105._24_8_ = auVar79._24_8_ + auVar78._24_8_ + dVar19 * dVar22;
      auVar78 = vmulpd_avx512vl(auVar82,local_ad0);
      auVar53._8_8_ = dStack_770;
      auVar53._0_8_ = local_778;
      auVar53._16_8_ = dStack_768;
      auVar53._24_8_ = dStack_760;
      auVar79 = vmulpd_avx512vl(auVar98,local_948);
      auVar110._0_8_ = (double)local_1720._0_8_ * dVar6 + auVar87._0_8_ + auVar78._0_8_;
      auVar110._8_8_ = (double)local_1720._8_8_ * dVar11 + auVar87._8_8_ + auVar78._8_8_;
      auVar110._16_8_ = (double)auStack_1710._0_8_ * dVar16 + auVar87._16_8_ + auVar78._16_8_;
      auVar110._24_8_ = (double)auStack_1710._8_8_ * dVar23 + auVar87._24_8_ + auVar78._24_8_;
      auVar82 = vmulpd_avx512vl(local_b10,local_ab0);
      auVar35._8_8_ = dStack_8d8;
      auVar35._0_8_ = local_8e0;
      auVar35._16_8_ = dStack_8d0;
      auVar35._24_8_ = dStack_8c8;
      auVar87 = vmulpd_avx512vl(local_840,local_7e0);
      auVar34._8_8_ = dStack_a40;
      auVar34._0_8_ = local_a48;
      auVar34._16_8_ = dStack_a38;
      auVar34._24_8_ = dStack_a30;
      auVar55._8_8_ = dStack_730;
      auVar55._0_8_ = local_738;
      auVar55._16_8_ = dStack_728;
      auVar55._24_8_ = dStack_720;
      auVar131._8_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar131._0_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar131._16_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar131._24_8_ =
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar78._8_8_ =
           dVar7 * dStack_3e0 +
           auVar83._8_8_ + auVar81._8_8_ + auVar80._8_8_ + auVar77._8_8_ + dStack_440 * dVar10;
      auVar78._0_8_ =
           dVar129 * local_3e8 +
           auVar83._0_8_ + auVar81._0_8_ + auVar80._0_8_ + auVar77._0_8_ + local_448 * dVar119;
      auVar78._16_8_ =
           dVar12 * dStack_3d8 +
           auVar83._16_8_ + auVar81._16_8_ + auVar80._16_8_ + auVar77._16_8_ + dStack_438 * dVar15;
      auVar78._24_8_ =
           dVar19 * dStack_3d0 +
           auVar83._24_8_ + auVar81._24_8_ + auVar80._24_8_ + auVar77._24_8_ + dStack_430 * dVar22;
      auVar77 = vmulpd_avx512vl(auVar131,auVar78);
      auVar77 = vaddpd_avx512vl(auVar105,auVar77);
      auVar78 = vmulpd_avx512vl(auVar131,stack0xffffffffffffe820);
      dStack_1268 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x18);
      auVar78 = vaddpd_avx512vl(auVar110,auVar78);
      auVar50._8_8_ = dStack_5e8;
      auVar50._0_8_ = local_5f0;
      auVar50._16_8_ = dStack_5e0;
      auVar50._24_8_ = dStack_5d8;
      vmovsd_avx512f(auVar67);
      local_12c0 = dStack_1268 * auVar77._0_8_ * *pdVar64;
      dStack_12b8 = dStack_1268 * auVar77._8_8_ * pdVar64[1];
      dStack_12b0 = dStack_1268 * auVar77._16_8_ * pdVar64[2];
      dStack_12a8 = dStack_1268 * auVar77._24_8_ * pdVar64[3];
      local_12a0 = dStack_1268 * auVar78._0_8_ * pdVar64[4];
      dStack_1298 = dStack_1268 * auVar78._8_8_ * pdVar64[5];
      dStack_1290 = dStack_1268 * auVar78._16_8_ * pdVar64[6];
      dStack_1288 = dStack_1268 * auVar78._24_8_ * pdVar64[7];
      auVar77 = vmulpd_avx512vl(auVar51,local_988);
      local_1280 = (auVar82._0_8_ + auVar79._0_8_ + auVar87._0_8_ +
                   local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (auVar86._0_8_ +
                   local_9a8 * local_510._0_8_ +
                   local_b10._0_8_ * local_678 + auVar84._0_8_ + auVar88._0_8_ + auVar85._0_8_)) *
                   pdVar64[8] * dStack_1268;
      dStack_1278 = (auVar82._8_8_ + auVar79._8_8_ + auVar87._8_8_ +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar86._8_8_ +
                    dStack_9a0 * local_510._8_8_ +
                    local_b10._8_8_ * dStack_670 + auVar84._8_8_ + auVar88._8_8_ + auVar85._8_8_)) *
                    pdVar64[9] * dStack_1268;
      dStack_1270 = (auVar82._16_8_ + auVar79._16_8_ + auVar87._16_8_ +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar86._16_8_ +
                    dStack_998 * local_510._16_8_ +
                    local_b10._16_8_ * dStack_668 + auVar84._16_8_ + auVar88._16_8_ + auVar85._16_8_
                    )) * pdVar64[10] * dStack_1268;
      dStack_1268 = (auVar82._24_8_ + auVar79._24_8_ + auVar87._24_8_ +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar86._24_8_ +
                    dStack_990 * local_510._24_8_ +
                    local_b10._24_8_ * dStack_660 + auVar84._24_8_ + auVar88._24_8_ + auVar85._24_8_
                    )) * pdVar64[0xb] * dStack_1268;
      auVar28._8_8_ = dStack_a20;
      auVar28._0_8_ = local_a28;
      auVar28._16_8_ = dStack_a18;
      auVar28._24_8_ = dStack_a10;
      auVar39._8_8_ = local_bb0._72_8_;
      auVar39._0_8_ = local_bb0._64_8_;
      auVar39._16_8_ = local_bb0._80_8_;
      auVar39._24_8_ = local_bb0._88_8_;
      auVar78 = vmulpd_avx512vl(auVar53,local_af0);
      auVar79 = vmulpd_avx512vl(auVar48,local_820);
      auVar80 = vmulpd_avx512vl(auVar96,local_6b8);
      auVar47._8_8_ = dStack_480;
      auVar47._0_8_ = local_488;
      auVar47._16_8_ = dStack_478;
      auVar47._24_8_ = dStack_470;
      auVar54._8_8_ = dStack_750;
      auVar54._0_8_ = local_758;
      auVar54._16_8_ = dStack_748;
      auVar54._24_8_ = dStack_740;
      auVar86._8_8_ = dStack_898;
      auVar86._0_8_ = local_8a0;
      auVar86._16_8_ = dStack_890;
      auVar86._24_8_ = dStack_888;
      auVar81 = vmulpd_avx512vl(auVar50,local_968);
      auVar82 = vmulpd_avx512vl(auVar54,local_ad0);
      auVar52._8_8_ = dStack_5c8;
      auVar52._0_8_ = local_5d0;
      auVar52._16_8_ = dStack_5c0;
      auVar52._24_8_ = dStack_5b8;
      auVar83 = vmulpd_avx512vl(auVar47,local_800);
      auVar85._8_8_ = local_bb0._40_8_;
      auVar85._0_8_ = local_bb0._32_8_;
      auVar85._16_8_ = local_bb0._48_8_;
      auVar85._24_8_ = local_bb0._56_8_;
      auVar84 = vmulpd_avx512vl(auVar85,local_698);
      auVar87 = vmulpd_avx512vl(auVar28,local_530);
      auVar49._8_8_ = dStack_460;
      auVar49._0_8_ = local_468;
      auVar49._16_8_ = dStack_458;
      auVar49._24_8_ = dStack_450;
      auVar30._8_8_ = dStack_a00;
      auVar30._0_8_ = local_a08;
      auVar30._16_8_ = dStack_9f8;
      auVar30._24_8_ = dStack_9f0;
      auVar88 = vmulpd_avx512vl(auVar52,local_948);
      auVar89 = vmulpd_avx512vl(auVar55,local_ab0);
      auVar90 = vmulpd_avx512vl(auVar49,local_7e0);
      auVar91 = vmulpd_avx512vl(auVar86,local_3a8);
      auVar92 = vmulpd_avx512vl(auVar34,local_988);
      auVar93 = vmulpd_avx512vl(auVar28,local_968);
      auVar94 = vmulpd_avx512vl(auVar96,local_af0);
      auVar95 = vmulpd_avx512vl(auVar35,local_820);
      auVar96 = vmulpd_avx512vl(auVar85,local_ad0);
      auVar97 = vmulpd_avx512vl(auVar30,local_948);
      auVar98 = vmulpd_avx512vl(auVar39,local_ab0);
      dVar7 = local_7e0._0_8_;
      dVar12 = local_7e0._8_8_;
      dVar17 = local_7e0._16_8_;
      dVar24 = local_7e0._24_8_;
      auVar106._0_8_ =
           (auVar94._0_8_ + auVar92._0_8_ + auVar95._0_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (local_8e0 * local_3e8 +
           local_a48 * local_550._0_8_ +
           auVar80._0_8_ + auVar78._0_8_ + auVar77._0_8_ + auVar79._0_8_)) * *pdVar64;
      auVar106._8_8_ =
           (auVar94._8_8_ + auVar92._8_8_ + auVar95._8_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_8d8 * dStack_3e0 +
           dStack_a40 * local_550._8_8_ +
           auVar80._8_8_ + auVar78._8_8_ + auVar77._8_8_ + auVar79._8_8_)) * pdVar64[1];
      auVar106._16_8_ =
           (auVar94._16_8_ + auVar92._16_8_ + auVar95._16_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_8d0 * dStack_3d8 +
           dStack_a38 * local_550._16_8_ +
           auVar80._16_8_ + auVar78._16_8_ + auVar77._16_8_ + auVar79._16_8_)) * pdVar64[2];
      auVar106._24_8_ =
           (auVar94._24_8_ + auVar92._24_8_ + auVar95._24_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_8c8 * dStack_3d0 +
           dStack_a30 * local_550._24_8_ +
           auVar80._24_8_ + auVar78._24_8_ + auVar77._24_8_ + auVar79._24_8_)) * pdVar64[3];
      auVar111._0_8_ =
           (auVar96._0_8_ + auVar93._0_8_ + local_8c0 * dVar6 +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (local_3c8 * local_8c0 +
           auVar87._0_8_ + auVar84._0_8_ + auVar82._0_8_ + auVar81._0_8_ + auVar83._0_8_)) *
           pdVar64[4];
      auVar111._8_8_ =
           (auVar96._8_8_ + auVar93._8_8_ + dStack_8b8 * dVar11 +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_3c0 * dStack_8b8 +
           auVar87._8_8_ + auVar84._8_8_ + auVar82._8_8_ + auVar81._8_8_ + auVar83._8_8_)) *
           pdVar64[5];
      auVar111._16_8_ =
           (auVar96._16_8_ + auVar93._16_8_ + dStack_8b0 * dVar16 +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_3b8 * dStack_8b0 +
           auVar87._16_8_ + auVar84._16_8_ + auVar82._16_8_ + auVar81._16_8_ + auVar83._16_8_)) *
           pdVar64[6];
      auVar111._24_8_ =
           (auVar96._24_8_ + auVar93._24_8_ + dStack_8a8 * dVar23 +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_3b0 * dStack_8a8 +
           auVar87._24_8_ + auVar84._24_8_ + auVar82._24_8_ + auVar81._24_8_ + auVar83._24_8_)) *
           pdVar64[7];
      dStack_16a8 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x20);
      auVar115._8_8_ = dStack_16a8;
      auVar115._0_8_ = dStack_16a8;
      auVar115._16_8_ = dStack_16a8;
      auVar115._24_8_ = dStack_16a8;
      auVar80._8_8_ = dStack_9e0;
      auVar80._0_8_ = local_9e8;
      auVar80._16_8_ = dStack_9d8;
      auVar80._24_8_ = dStack_9d0;
      vmovsd_avx512f(auVar67);
      auVar46._8_8_ = dStack_1138;
      auVar46._0_8_ = local_1140;
      auVar46._16_8_ = dStack_1130;
      auVar46._24_8_ = dStack_1128;
      local_1640 = vmulpd_avx512vl(auVar106,auVar115);
      auVar44._8_8_ = dStack_1178;
      auVar44._0_8_ = local_1180;
      auVar44._16_8_ = dStack_1170;
      auVar44._24_8_ = dStack_1168;
      local_1440 = vmulpd_avx512vl(auVar111,auVar115);
      local_16c0._0_8_ =
           (auVar98._0_8_ + auVar97._0_8_ + local_8a0 * dVar7 +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (auVar91._0_8_ +
           local_a08 * local_510._0_8_ +
           (double)local_bb0._64_8_ * local_678 + auVar89._0_8_ + auVar88._0_8_ + auVar90._0_8_)) *
           pdVar64[8] * dStack_16a8;
      local_16c0._8_8_ =
           (auVar98._8_8_ + auVar97._8_8_ + dStack_898 * dVar12 +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (auVar91._8_8_ +
           dStack_a00 * local_510._8_8_ +
           (double)local_bb0._72_8_ * dStack_670 + auVar89._8_8_ + auVar88._8_8_ + auVar90._8_8_)) *
           pdVar64[9] * dStack_16a8;
      dStack_16b0 = (auVar98._16_8_ + auVar97._16_8_ + dStack_890 * dVar17 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar91._16_8_ +
                    dStack_9f8 * local_510._16_8_ +
                    (double)local_bb0._80_8_ * dStack_668 +
                    auVar89._16_8_ + auVar88._16_8_ + auVar90._16_8_)) * pdVar64[10] * dStack_16a8;
      dStack_16a8 = (auVar98._24_8_ + auVar97._24_8_ + dStack_888 * dVar24 +
                    local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar91._24_8_ +
                    dStack_9f0 * local_510._24_8_ +
                    (double)local_bb0._88_8_ * dStack_660 +
                    auVar89._24_8_ + auVar88._24_8_ + auVar90._24_8_)) * pdVar64[0xb] * dStack_16a8;
      auVar77 = vmulpd_avx512vl(auVar53,local_bb0._96_32_);
      auVar83._8_8_ = dStack_b28;
      auVar83._0_8_ = local_b30;
      auVar83._16_8_ = dStack_b20;
      auVar83._24_8_ = dStack_b18;
      auVar78 = vmulpd_avx512vl(auVar48,local_880);
      local_13a0._0_8_ = local_718._0_8_;
      local_13a0._8_8_ = local_718._8_8_;
      dStack_1390 = local_718._16_8_;
      dStack_1388 = local_718._24_8_;
      local_1800._0_8_ =
           local_8e0 * local_448 +
           local_a48 * local_5b0 +
           (double)local_bb0._0_8_ * (double)local_13a0._0_8_ +
           auVar77._0_8_ + local_610 * local_9e8 + auVar78._0_8_;
      local_1800._8_8_ =
           dStack_8d8 * dStack_440 +
           dStack_a40 * dStack_5a8 +
           (double)local_bb0._8_8_ * (double)local_13a0._8_8_ +
           auVar77._8_8_ + dStack_608 * dStack_9e0 + auVar78._8_8_;
      local_1800._16_8_ =
           dStack_8d0 * dStack_438 +
           dStack_a38 * dStack_5a0 +
           (double)local_bb0._16_8_ * dStack_1390 +
           auVar77._16_8_ + dStack_600 * dStack_9d8 + auVar78._16_8_;
      local_1800._24_8_ =
           dStack_8c8 * dStack_430 +
           dStack_a30 * dStack_598 +
           (double)local_bb0._24_8_ * dStack_1388 +
           auVar77._24_8_ + dStack_5f8 * dStack_9d0 + auVar78._24_8_;
      auVar95._8_8_ = dStack_9c0;
      auVar95._0_8_ = local_9c8;
      auVar95._16_8_ = dStack_9b8;
      auVar95._24_8_ = dStack_9b0;
      auVar77 = vmulpd_avx512vl(auVar50,auVar95);
      auVar78 = vmulpd_avx512vl(auVar47,local_860);
      auVar26._8_8_ = dStack_9a0;
      auVar26._0_8_ = local_9a8;
      auVar26._16_8_ = dStack_998;
      auVar26._24_8_ = dStack_990;
      auVar90._8_8_ = dStack_6f0;
      auVar90._0_8_ = local_6f8;
      auVar90._16_8_ = dStack_6e8;
      auVar90._24_8_ = dStack_6e0;
      auVar79 = vmulpd_avx512vl(auVar85,auVar90);
      auVar33._8_8_ = dStack_588;
      auVar33._0_8_ = local_590;
      auVar33._16_8_ = dStack_580;
      auVar33._24_8_ = dStack_578;
      auVar81 = vmulpd_avx512vl(auVar28,auVar33);
      local_1320._0_8_ = local_428._0_8_;
      local_1320._8_8_ = local_428._8_8_;
      dStack_1310 = local_428._16_8_;
      dStack_1308 = local_428._24_8_;
      local_1800._32_8_ =
           local_8c0 * (double)local_1320._0_8_ +
           auVar81._0_8_ + auVar79._0_8_ + local_b30 * local_758 + auVar77._0_8_ + auVar78._0_8_;
      dStack_17d8 = dStack_8b8 * (double)local_1320._8_8_ +
                    auVar81._8_8_ +
                    auVar79._8_8_ + dStack_b28 * dStack_750 + auVar77._8_8_ + auVar78._8_8_;
      dStack_17d0 = dStack_8b0 * dStack_1310 +
                    auVar81._16_8_ +
                    auVar79._16_8_ + dStack_b20 * dStack_748 + auVar77._16_8_ + auVar78._16_8_;
      dStack_17c8 = dStack_8a8 * dStack_1308 +
                    auVar81._24_8_ +
                    auVar79._24_8_ + dStack_b18 * dStack_740 + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(auVar52,auVar26);
      auVar78 = vmulpd_avx512vl(auVar55,local_b10);
      auVar79 = vmulpd_avx512vl(auVar49,local_840);
      auVar93._8_8_ = dStack_6d0;
      auVar93._0_8_ = local_6d8;
      auVar93._16_8_ = dStack_6c8;
      auVar93._24_8_ = dStack_6c0;
      auVar81 = vmulpd_avx512vl(auVar39,auVar93);
      local_1340._0_8_ = local_408._0_8_;
      local_1340._8_8_ = local_408._8_8_;
      dStack_1330 = local_408._16_8_;
      dStack_1328 = local_408._24_8_;
      local_17c0 = local_8a0 * (double)local_1340._0_8_ +
                   local_a08 * local_570 +
                   auVar81._0_8_ + auVar78._0_8_ + auVar77._0_8_ + auVar79._0_8_;
      dStack_17b8 = dStack_898 * (double)local_1340._8_8_ +
                    dStack_a00 * dStack_568 +
                    auVar81._8_8_ + auVar78._8_8_ + auVar77._8_8_ + auVar79._8_8_;
      dStack_17b0 = dStack_890 * dStack_1330 +
                    dStack_9f8 * dStack_560 +
                    auVar81._16_8_ + auVar78._16_8_ + auVar77._16_8_ + auVar79._16_8_;
      dStack_17a8 = dStack_888 * dStack_1328 +
                    dStack_9f0 * dStack_558 +
                    auVar81._24_8_ + auVar78._24_8_ + auVar77._24_8_ + auVar79._24_8_;
      auVar77 = vmulpd_avx512vl(auVar28,auVar95);
      auVar78 = vmulpd_avx512vl(auVar30,auVar26);
      auVar79 = vmulpd_avx512vl(auVar86,local_840);
      auVar81 = vmulpd_avx512vl(auVar35,local_880);
      auVar82 = vmulpd_avx512vl(auVar85,auVar83);
      auVar45._8_8_ = dStack_1158;
      auVar45._0_8_ = local_1160;
      auVar45._16_8_ = dStack_1150;
      auVar45._24_8_ = dStack_1148;
      auVar83 = vmulpd_avx512vl(auVar39,local_b10);
      dVar129 = *(double *)
                 ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x28);
      auVar118._0_8_ =
           ((double)local_bb0._0_8_ * dVar132 + local_a48 * local_9e8 + auVar81._0_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1800._0_8_) * *pdVar64 * dVar129;
      auVar118._8_8_ =
           ((double)local_bb0._8_8_ * dVar8 + dStack_a40 * dStack_9e0 + auVar81._8_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1800._8_8_) * pdVar64[1] * dVar129;
      auVar118._16_8_ =
           ((double)local_bb0._16_8_ * dVar13 + dStack_a38 * dStack_9d8 + auVar81._16_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1800._16_8_) * pdVar64[2] * dVar129;
      auVar118._24_8_ =
           ((double)local_bb0._24_8_ * dVar20 + dStack_a30 * dStack_9d0 + auVar81._24_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1800._24_8_) * pdVar64[3] * dVar129;
      auVar112._0_8_ =
           (auVar83._0_8_ + auVar78._0_8_ + auVar79._0_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * local_17c0) * pdVar64[8] * dVar129;
      auVar112._8_8_ =
           (auVar83._8_8_ + auVar78._8_8_ + auVar79._8_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_17b8) * pdVar64[9] * dVar129;
      auVar112._16_8_ =
           (auVar83._16_8_ + auVar78._16_8_ + auVar79._16_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_17b0) * pdVar64[10] * dVar129;
      auVar112._24_8_ =
           (auVar83._24_8_ + auVar78._24_8_ + auVar79._24_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_17a8) * pdVar64[0xb] * dVar129;
      auVar116._0_8_ =
           (auVar82._0_8_ + auVar77._0_8_ + local_8c0 * (double)local_1720._0_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1800._32_8_) * pdVar64[4] * dVar129;
      auVar116._8_8_ =
           (auVar82._8_8_ + auVar77._8_8_ + dStack_8b8 * (double)local_1720._8_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_17d8) * pdVar64[5] * dVar129;
      auVar116._16_8_ =
           (auVar82._16_8_ + auVar77._16_8_ + dStack_8b0 * (double)auStack_1710._0_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_17d0) * pdVar64[6] * dVar129;
      auVar116._24_8_ =
           (auVar82._24_8_ + auVar77._24_8_ + dStack_8a8 * (double)auStack_1710._8_8_ +
           local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_17c8) * pdVar64[7] * dVar129;
      auVar77 = vmulpd_avx512vl(local_af0,local_1640);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0] = auVar77._0_8_ + (double)local_bb0._0_8_ * local_1180 + dVar132 * auVar118._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[1] = auVar77._8_8_ + (double)local_bb0._8_8_ * dStack_1178 + dVar8 * auVar118._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[2] = auVar77._16_8_ + (double)local_bb0._16_8_ * dStack_1170 + dVar13 * auVar118._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[3] = auVar77._24_8_ + (double)local_bb0._24_8_ * dStack_1168 + dVar20 * auVar118._24_8_;
      auVar77 = vmulpd_avx512vl(auVar85,auVar45);
      auVar78 = vmulpd_avx512vl(local_ad0,local_1440);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[4] = auVar78._0_8_ + auVar77._0_8_ + local_b30 * auVar116._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[5] = auVar78._8_8_ + auVar77._8_8_ + dStack_b28 * auVar116._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[6] = auVar78._16_8_ + auVar77._16_8_ + dStack_b20 * auVar116._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[7] = auVar78._24_8_ + auVar77._24_8_ + dStack_b18 * auVar116._24_8_;
      auVar77 = vmulpd_avx512vl(local_b10,auVar112);
      auVar78 = vmulpd_avx512vl(auVar39,auVar46);
      auVar79 = vmulpd_avx512vl(local_ab0,_local_16c0);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[8] = auVar79._0_8_ + auVar78._0_8_ + auVar77._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[9] = auVar79._8_8_ + auVar78._8_8_ + auVar77._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[10] = auVar79._16_8_ + auVar78._16_8_ + auVar77._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xb] = auVar79._24_8_ + auVar78._24_8_ + auVar77._24_8_;
      auVar77 = vmulpd_avx512vl(auVar80,auVar118);
      auVar78 = vmulpd_avx512vl(auVar34,auVar44);
      auVar79 = vmulpd_avx512vl(local_988,local_1640);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2d] = auVar79._0_8_ + auVar78._0_8_ + auVar77._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2e] = auVar79._8_8_ + auVar78._8_8_ + auVar77._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2f] = auVar79._16_8_ + auVar78._16_8_ + auVar77._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x30] = auVar79._24_8_ + auVar78._24_8_ + auVar77._24_8_;
      auVar77 = vmulpd_avx512vl(auVar28,auVar45);
      auVar78 = vmulpd_avx512vl(local_968,local_1440);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x31] = auVar78._0_8_ + auVar77._0_8_ + local_9c8 * auVar116._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x32] = auVar78._8_8_ + auVar77._8_8_ + dStack_9c0 * auVar116._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x33] = auVar78._16_8_ + auVar77._16_8_ + dStack_9b8 * auVar116._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x34] = auVar78._24_8_ + auVar77._24_8_ + dStack_9b0 * auVar116._24_8_;
      auVar77 = vmulpd_avx512vl(auVar26,auVar112);
      auVar78 = vmulpd_avx512vl(auVar30,auVar46);
      auVar38._8_8_ = dStack_1278;
      auVar38._0_8_ = local_1280;
      auVar38._16_8_ = dStack_1270;
      auVar38._24_8_ = dStack_1268;
      auVar79 = vmulpd_avx512vl(local_948,_local_16c0);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x35] = auVar79._0_8_ + auVar78._0_8_ + auVar77._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x36] = auVar79._8_8_ + auVar78._8_8_ + auVar77._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x37] = auVar79._16_8_ + auVar78._16_8_ + auVar77._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x38] = auVar79._24_8_ + auVar78._24_8_ + auVar77._24_8_;
      auVar77 = vmulpd_avx512vl(local_880,auVar118);
      auVar78 = vmulpd_avx512vl(auVar35,auVar44);
      auVar27._8_8_ = dStack_8b8;
      auVar27._0_8_ = local_8c0;
      auVar27._16_8_ = dStack_8b0;
      auVar27._24_8_ = dStack_8a8;
      auVar42._8_8_ = dStack_11b8;
      auVar42._0_8_ = local_11c0;
      auVar42._16_8_ = dStack_11b0;
      auVar42._24_8_ = dStack_11a8;
      auVar79 = vmulpd_avx512vl(local_820,local_1640);
      auVar97._8_8_ = local_bb0._8_8_;
      auVar97._0_8_ = local_bb0._0_8_;
      auVar97._16_8_ = local_bb0._16_8_;
      auVar97._24_8_ = local_bb0._24_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5a] = auVar79._0_8_ + auVar78._0_8_ + auVar77._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5b] = auVar79._8_8_ + auVar78._8_8_ + auVar77._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5c] = auVar79._16_8_ + auVar78._16_8_ + auVar77._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5d] = auVar79._24_8_ + auVar78._24_8_ + auVar77._24_8_;
      auVar77 = vmulpd_avx512vl(local_860,auVar116);
      auVar78 = vmulpd_avx512vl(auVar27,auVar45);
      auVar43._8_8_ = dStack_1198;
      auVar43._0_8_ = local_11a0;
      auVar43._16_8_ = dStack_1190;
      auVar43._24_8_ = dStack_1188;
      dVar129 = local_1440._0_8_;
      dVar19 = local_1440._8_8_;
      dVar18 = local_1440._16_8_;
      dVar25 = local_1440._24_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5e] = dVar6 * dVar129 + auVar78._0_8_ + auVar77._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5f] = dVar11 * dVar19 + auVar78._8_8_ + auVar77._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x60] = dVar16 * dVar18 + auVar78._16_8_ + auVar77._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x61] = dVar23 * dVar25 + auVar78._24_8_ + auVar77._24_8_;
      auVar87._8_8_ = dStack_898;
      auVar87._0_8_ = local_8a0;
      auVar87._16_8_ = dStack_890;
      auVar87._24_8_ = dStack_888;
      auVar77 = vmulpd_avx512vl(auVar46,auVar87);
      auVar41._8_8_ = dStack_11d8;
      auVar41._0_8_ = local_11e0;
      auVar41._16_8_ = dStack_11d0;
      auVar41._24_8_ = dStack_11c8;
      auVar78 = vmulpd_avx512vl(local_7e0,_local_16c0);
      auVar84._8_8_ = dStack_b28;
      auVar84._0_8_ = local_b30;
      auVar84._16_8_ = dStack_b20;
      auVar84._24_8_ = dStack_b18;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x62] = auVar78._0_8_ + auVar77._0_8_ + auVar112._0_8_ * dVar133;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[99] = auVar78._8_8_ + auVar77._8_8_ + auVar112._8_8_ * dVar9;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[100] = auVar78._16_8_ + auVar77._16_8_ + auVar112._16_8_ * dVar14;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x65] = auVar78._24_8_ + auVar77._24_8_ + auVar112._24_8_ * dVar21;
      auVar77 = vmulpd_avx512vl(local_bb0._96_32_,auVar41);
      auVar36._8_8_ = dStack_12b8;
      auVar36._0_8_ = local_12c0;
      auVar36._16_8_ = dStack_12b0;
      auVar36._24_8_ = dStack_12a8;
      auVar78 = vmulpd_avx512vl(auVar97,auVar118);
      auVar37._8_8_ = dStack_1298;
      auVar37._0_8_ = local_12a0;
      auVar37._16_8_ = dStack_1290;
      auVar37._24_8_ = dStack_1288;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xc] = local_af0._0_8_ * local_12c0 + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xd] = local_af0._8_8_ * dStack_12b8 + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xe] = local_af0._16_8_ * dStack_12b0 + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xf] = local_af0._24_8_ * dStack_12a8 + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(auVar84,auVar42);
      auVar78 = vmulpd_avx512vl(local_ad0,auVar37);
      auVar29._8_8_ = dStack_a20;
      auVar29._0_8_ = local_a28;
      auVar29._16_8_ = dStack_a18;
      auVar29._24_8_ = dStack_a10;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x10] = auVar78._0_8_ + auVar77._0_8_ + auVar116._0_8_ * (double)local_bb0._32_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x11] = auVar78._8_8_ + auVar77._8_8_ + auVar116._8_8_ * (double)local_bb0._40_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x12] = auVar78._16_8_ + auVar77._16_8_ + auVar116._16_8_ * (double)local_bb0._48_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x13] = auVar78._24_8_ + auVar77._24_8_ + auVar116._24_8_ * (double)local_bb0._56_8_;
      auVar77 = vmulpd_avx512vl(local_b10,auVar43);
      auVar78 = vmulpd_avx512vl(auVar39,auVar112);
      auVar79 = vmulpd_avx512vl(local_ab0,auVar38);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x14] = auVar79._0_8_ + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x15] = auVar79._8_8_ + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x16] = auVar79._16_8_ + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x17] = auVar79._24_8_ + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(auVar80,auVar41);
      auVar88._8_8_ = dStack_898;
      auVar88._0_8_ = local_8a0;
      auVar88._16_8_ = dStack_890;
      auVar88._24_8_ = dStack_888;
      auVar78 = vmulpd_avx512vl(auVar34,auVar118);
      auVar79 = vmulpd_avx512vl(auVar35,auVar118);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x39] = dVar101 * local_12c0 + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3a] = dVar107 * dStack_12b8 + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3b] = dVar108 * dStack_12b0 + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3c] = dVar109 * dStack_12a8 + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(auVar95,auVar42);
      auVar78 = vmulpd_avx512vl(auVar29,auVar116);
      auVar80 = vmulpd_avx512vl(auVar27,auVar116);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3d] = local_968._0_8_ * local_12a0 + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3e] = local_968._8_8_ * dStack_1298 + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3f] = local_968._16_8_ * dStack_1290 + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x40] = local_968._24_8_ * dStack_1288 + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(auVar26,auVar43);
      auVar78 = vmulpd_avx512vl(auVar30,auVar112);
      auVar81 = vmulpd_avx512vl(auVar88,auVar112);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x41] = local_948._0_8_ * local_1280 + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x42] = local_948._8_8_ * dStack_1278 + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x43] = local_948._16_8_ * dStack_1270 + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x44] = local_948._24_8_ * dStack_1268 + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(local_880,auVar41);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x66] = dVar119 * local_12c0 + auVar77._0_8_ + auVar79._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x67] = dVar10 * dStack_12b8 + auVar77._8_8_ + auVar79._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x68] = dVar15 * dStack_12b0 + auVar77._16_8_ + auVar79._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x69] = dVar22 * dStack_12a8 + auVar77._24_8_ + auVar79._24_8_;
      auVar77 = vmulpd_avx512vl(local_860,auVar42);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6a] = dVar6 * local_12a0 + auVar77._0_8_ + auVar80._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6b] = dVar11 * dStack_1298 + auVar77._8_8_ + auVar80._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6c] = dVar16 * dStack_1290 + auVar77._16_8_ + auVar80._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6d] = dVar23 * dStack_1288 + auVar77._24_8_ + auVar80._24_8_;
      auVar77 = vmulpd_avx512vl(local_840,auVar43);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6e] = dVar7 * local_1280 + auVar77._0_8_ + auVar81._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6f] = dVar12 * dStack_1278 + auVar77._8_8_ + auVar81._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x70] = dVar17 * dStack_1270 + auVar77._16_8_ + auVar81._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x71] = dVar24 * dStack_1268 + auVar77._24_8_ + auVar81._24_8_;
      auVar77 = vmulpd_avx512vl(auVar97,local_1640);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x18] = local_1240 * local_af0._0_8_ + local_12c0 * dVar132 + auVar77._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x19] = dStack_1238 * local_af0._8_8_ + dStack_12b8 * dVar8 + auVar77._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1a] = dStack_1230 * local_af0._16_8_ + dStack_12b0 * dVar13 + auVar77._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1b] = dStack_1228 * local_af0._24_8_ + dStack_12a8 * dVar20 + auVar77._24_8_;
      auVar77 = vmulpd_avx512vl(auVar84,auVar37);
      auVar40._8_8_ = dStack_11f8;
      auVar40._0_8_ = local_1200;
      auVar40._16_8_ = dStack_11f0;
      auVar40._24_8_ = dStack_11e8;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1c] = local_1220 * local_ad0._0_8_ +
                    auVar77._0_8_ + dVar129 * (double)local_bb0._32_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1d] = dStack_1218 * local_ad0._8_8_ +
                    auVar77._8_8_ + dVar19 * (double)local_bb0._40_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1e] = dStack_1210 * local_ad0._16_8_ +
                    auVar77._16_8_ + dVar18 * (double)local_bb0._48_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1f] = dStack_1208 * local_ad0._24_8_ +
                    auVar77._24_8_ + dVar25 * (double)local_bb0._56_8_;
      auVar77 = vmulpd_avx512vl(local_b10,auVar38);
      auVar78 = vmulpd_avx512vl(local_ab0,auVar40);
      auVar79 = vmulpd_avx512vl(auVar39,_local_16c0);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x20] = auVar78._0_8_ + auVar77._0_8_ + auVar79._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x21] = auVar78._8_8_ + auVar77._8_8_ + auVar79._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x22] = auVar78._16_8_ + auVar77._16_8_ + auVar79._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x23] = auVar78._24_8_ + auVar77._24_8_ + auVar79._24_8_;
      auVar81._8_8_ = dStack_9e0;
      auVar81._0_8_ = local_9e8;
      auVar81._16_8_ = dStack_9d8;
      auVar81._24_8_ = dStack_9d0;
      auVar77 = vmulpd_avx512vl(auVar36,auVar81);
      auVar78 = vmulpd_avx512vl(auVar34,local_1640);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x45] = local_1240 * dVar101 + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x46] = dStack_1238 * dVar107 + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x47] = dStack_1230 * dVar108 + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x48] = dStack_1228 * dVar109 + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(auVar95,auVar37);
      auVar78 = vmulpd_avx512vl(auVar29,local_1440);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x49] = local_1220 * local_968._0_8_ + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4a] = dStack_1218 * local_968._8_8_ + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4b] = dStack_1210 * local_968._16_8_ + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4c] = dStack_1208 * local_968._24_8_ + auVar77._24_8_ + auVar78._24_8_;
      auVar77 = vmulpd_avx512vl(auVar26,auVar38);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4d] = local_948._0_8_ * local_1200 +
                    auVar77._0_8_ + (double)local_16c0._0_8_ * local_a08;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4e] = local_948._8_8_ * dStack_11f8 +
                    auVar77._8_8_ + (double)local_16c0._8_8_ * dStack_a00;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4f] = local_948._16_8_ * dStack_11f0 + auVar77._16_8_ + dStack_16b0 * dStack_9f8;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x50] = local_948._24_8_ * dStack_11e8 + auVar77._24_8_ + dStack_16a8 * dStack_9f0;
      auVar77 = vmulpd_avx512vl(local_880,auVar36);
      auVar78 = vmulpd_avx512vl(auVar35,local_1640);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x72] = dVar119 * local_1240 + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x73] = dVar10 * dStack_1238 + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x74] = dVar15 * dStack_1230 + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x75] = dVar22 * dStack_1228 + auVar77._24_8_ + auVar78._24_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x76] = dVar6 * local_1220 + (double)local_1720._0_8_ * local_12a0 + local_8c0 * dVar129
      ;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x77] = dVar11 * dStack_1218 +
                    (double)local_1720._8_8_ * dStack_1298 + dStack_8b8 * dVar19;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x78] = dVar16 * dStack_1210 +
                    (double)auStack_1710._0_8_ * dStack_1290 + dStack_8b0 * dVar18;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x79] = dVar23 * dStack_1208 +
                    (double)auStack_1710._8_8_ * dStack_1288 + dStack_8a8 * dVar25;
      auVar77 = vmulpd_avx512vl(local_840,auVar38);
      auVar78 = vmulpd_avx512vl(auVar88,_local_16c0);
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7a] = dVar7 * local_1200 + auVar77._0_8_ + auVar78._0_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7b] = dVar12 * dStack_11f8 + auVar77._8_8_ + auVar78._8_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7c] = dVar17 * dStack_11f0 + auVar77._16_8_ + auVar78._16_8_;
      local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7d] = dVar24 * dStack_11e8 + auVar77._24_8_ + auVar78._24_8_;
      _local_1720 = auVar56;
      _local_13a0 = auVar57;
      _local_1340 = auVar58;
      _local_1320 = auVar59;
      if (((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows == 3) &&
         ((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols == 1)) {
        auVar76._8_8_ = 0;
        auVar76._0_8_ = dVar125;
        pauVar5 = (undefined1 (*) [16])
                  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        p_Var4 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_618;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = local_a50;
        auVar67 = vmulsd_avx512f(auVar139,auVar69);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = local_4b0;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = local_8e8;
        auVar68 = vmulsd_avx512f(auVar135,auVar70);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = local_348;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = local_780;
        auVar69 = vmulsd_avx512f(auVar137,auVar73);
        dVar125 = *(double *)pauVar5[1];
        auVar120._8_8_ = 0;
        auVar120._0_8_ = dVar125;
        auVar70 = vmovddup_avx512vl(auVar76);
        auVar67 = vaddsd_avx512f(auVar67,auVar68);
        auVar69 = vaddsd_avx512f(auVar67,auVar69);
        auVar102._8_8_ = 0;
        auVar102._0_8_ = local_a80 * local_648 + local_918 * local_4e0 + local_7b0 * local_378;
        auVar67 = vmulsd_avx512f(auVar76,auVar102);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = local_a80 * local_a80 + local_918 * local_918 + local_7b0 * local_7b0 + -1.0
        ;
        auVar68 = vmulsd_avx512f(auVar75,ZEXT816(0x3fe0000000000000));
        auVar99._8_8_ = 0;
        auVar99._0_8_ = auVar67._0_8_ + auVar68._0_8_;
        auVar71 = vmulsd_avx512f(auVar99,auVar120);
        auVar67 = *pauVar5;
        peVar3 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        dVar129 = auVar70._0_8_;
        dVar132 = auVar70._8_8_;
        auVar103._0_8_ =
             (local_a90 * local_a90 + local_928 * local_928 + local_7c0 * local_7c0 + -1.0) * 0.5 +
             dVar129 * (local_a90 * local_658 + local_928 * local_4f0 + local_7c0 * local_388);
        auVar103._8_8_ =
             (dStack_a88 * dStack_a88 + dStack_920 * dStack_920 + dStack_7b8 * dStack_7b8 + -1.0) *
             0.5 + dVar132 * (dStack_a88 * dStack_650 + dStack_920 * dStack_4e8 +
                             dStack_7b8 * dStack_380);
        auVar72 = vmulpd_avx512vl(auVar67,auVar103);
        auVar123._0_8_ =
             (local_a78 * local_a78 + local_910 * local_910 + local_7a8 * local_7a8 + -1.0) * 0.5 +
             (local_a78 * local_640 + local_910 * local_4d8 + local_7a8 * local_370) * dVar129;
        auVar123._8_8_ =
             (dStack_a70 * dStack_a70 + dStack_908 * dStack_908 + dStack_7a0 * dStack_7a0 + -1.0) *
             0.5 + (dStack_a70 * dStack_638 + dStack_908 * dStack_4d0 + dStack_7a0 * dStack_368) *
                   dVar132;
        auVar68 = vmulpd_avx512vl(auVar67,auVar123);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = local_900 * local_4c8 + local_a68 * local_630 + local_798 * local_360;
        auVar70 = vmulsd_avx512f(auVar76,auVar134);
        auVar126._8_8_ = 0;
        auVar126._0_8_ =
             local_a68 * local_a68 + local_900 * local_900 + local_798 * local_798 + -1.0;
        auVar73 = vmulsd_avx512f(auVar126,ZEXT816(0x3fe0000000000000));
        auVar127._8_8_ = 0;
        auVar127._0_8_ = auVar70._0_8_ + auVar73._0_8_;
        auVar74 = vmulsd_avx512f(auVar120,auVar127);
        auVar136._8_8_ = 0;
        auVar136._0_8_ = local_8e8;
        auVar70 = vmulsd_avx512f(auVar135,auVar136);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = local_a50;
        auVar73 = vmulsd_avx512f(auVar139,auVar140);
        auVar138._8_8_ = 0;
        auVar138._0_8_ = local_780;
        auVar75 = vmulsd_avx512f(auVar137,auVar138);
        auVar69 = vmulsd_avx512f(auVar76,auVar69);
        auVar113._8_8_ = 0;
        auVar113._0_8_ = auVar73._0_8_ + auVar70._0_8_ + auVar75._0_8_ + -1.0;
        auVar70 = vmulsd_avx512f(auVar113,ZEXT816(0x3fe0000000000000));
        dVar129 = auVar67._0_8_ *
                  ((local_a60 * local_a60 + local_8f8 * local_8f8 + local_790 * local_790 + -1.0) *
                   0.5 + (local_a60 * local_628 + local_8f8 * local_4c0 + local_790 * local_358) *
                         dVar129);
        dVar132 = auVar67._8_8_ *
                  ((dStack_a58 * dStack_a58 + dStack_8f0 * dStack_8f0 + dStack_788 * dStack_788 +
                   -1.0) * 0.5 +
                  (dStack_a58 * dStack_620 + dStack_8f0 * dStack_4b8 + dStack_788 * dStack_350) *
                  dVar132);
        dVar125 = dVar125 * (auVar69._0_8_ + auVar70._0_8_);
        if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          auVar67 = *(undefined1 (*) [16])
                     (peVar3->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array;
          auVar69 = *(undefined1 (*) [16])
                     ((long)(peVar3->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          auVar1 = *(undefined1 (*) [16])
                    ((long)(peVar3->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x20);
          auVar2 = *(undefined1 (*) [16])
                    ((long)(peVar3->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x30);
          dVar133 = *(double *)
                     ((long)(peVar3->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x40);
        }
        else {
          vmovsd_avx512f(auVar71);
          local_16e0 = auVar72._0_8_;
          dStack_16d8 = auVar72._8_8_;
          vmovsd_avx512f(auVar74);
          auStack_1710 = local_860._16_16_;
          local_1720 = auVar68;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
          local_1780._16_16_ = local_bb0._112_16_;
          local_1780._0_16_ =
               *(undefined1 (*) [16])
                (peVar3->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                m_storage.m_data.array;
          auVar69 = *(undefined1 (*) [16])
                     ((long)(peVar3->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          local_1660 = *(double *)
                        ((long)(peVar3->m_Dv).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x20);
          dStack_1658 = *(double *)
                         ((long)(peVar3->m_Dv).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 0x28);
          local_1680 = *(double *)
                        ((long)(peVar3->m_Dv).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x30);
          dStack_1678 = *(double *)
                         ((long)(peVar3->m_Dv).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 0x38);
          local_16a0 = *(double *)
                        ((long)(peVar3->m_Dv).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x40);
          dStack_1698 = 0.0;
          local_1760 = dVar129;
          dStack_1758 = dVar132;
          local_1740 = dVar125;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          auVar1._8_8_ = dStack_1658;
          auVar1._0_8_ = local_1660;
          auVar2._8_8_ = dStack_1678;
          auVar2._0_8_ = local_1680;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = local_17a0._0_8_;
          auVar72._8_8_ = dStack_16d8;
          auVar72._0_8_ = local_16e0;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = local_1700;
          auVar67 = local_1780._0_16_;
          auVar68 = local_1720;
          dVar125 = local_1740;
          dVar133 = local_16a0;
          dVar129 = local_1760;
          dVar132 = dStack_1758;
        }
        auVar117._8_8_ = auVar67._0_8_;
        auVar117._0_8_ = auVar67._0_8_;
        auVar70 = vshufpd_avx(auVar67,auVar67,3);
        auVar73 = vshufpd_avx(auVar67,auVar67,1);
        auVar121._8_8_ = auVar1._0_8_;
        auVar121._0_8_ = auVar1._0_8_;
        auVar70 = vmulpd_avx512vl(auVar68,auVar70);
        auVar73 = vmulsd_avx512f(auVar74,auVar73);
        auVar76 = vmulpd_avx512vl(auVar72,auVar117);
        auVar75 = vmulpd_avx512vl(auVar68,auVar121);
        dVar119 = auVar69._0_8_;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = dVar129 * dVar119 + auVar76._0_8_ + auVar70._0_8_;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = dVar132 * dVar119 + auVar76._8_8_ + auVar70._8_8_;
        auVar70 = vmulsd_avx512f(auVar71,auVar67);
        auVar67 = vshufpd_avx(auVar1,auVar1,1);
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = dVar125 * dVar119 + auVar70._0_8_ + auVar73._0_8_;
        auVar70 = vshufpd_avx(auVar69,auVar69,1);
        auVar69 = vshufpd_avx(auVar69,auVar69,3);
        auVar73 = vmulpd_avx512vl(auVar72,auVar69);
        auVar70 = vmulsd_avx512f(auVar71,auVar70);
        auVar69 = vshufpd_avx(auVar1,auVar1,3);
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x54] = dVar129 * auVar69._0_8_ + auVar75._0_8_ + auVar73._0_8_;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x55] = dVar132 * auVar69._8_8_ + auVar75._8_8_ + auVar73._8_8_;
        auVar73 = vmulsd_avx512f(auVar74,auVar1);
        auVar69 = vshufpd_avx(auVar2,auVar2,3);
        auVar68 = vmulpd_avx512vl(auVar68,auVar69);
        auVar122._8_8_ = auVar2._0_8_;
        auVar122._0_8_ = auVar2._0_8_;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x81] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x54] * local_7a8;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x82] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x55] * dStack_7a0;
        auVar69 = vmulpd_avx512vl(auVar72,auVar122);
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = dVar125 * auVar67._0_8_ + auVar73._0_8_ + auVar70._0_8_;
        auVar67 = vshufpd_avx(auVar2,auVar2,1);
        auVar67 = vmulsd_avx512f(auVar74,auVar67);
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x26] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_a80;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x29] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_a68;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x56] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_900;
        auVar70 = vmulsd_avx512f(auVar71,auVar2);
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x24] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_a90;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x25] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_a88;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = dVar129 * dVar133 + auVar69._0_8_ + auVar68._0_8_;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = dVar132 * dVar133 + auVar69._8_8_ + auVar68._8_8_;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = dVar125 * dVar133 + auVar70._0_8_ + auVar67._0_8_;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x51] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_928;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x52] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_920;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x53] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_918;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_7c0;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_7b8;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_7b0;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x27] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x54] * local_a78;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x28] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x55] * dStack_a70;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x54] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x54] * local_910;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x55] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x55] * dStack_908;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_798;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2a] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_a60;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2b] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_a58;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2c] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_a50;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x57] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_8f8;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x58] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_8f0;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x59] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_8e8;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_790;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_788;
        local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = local_ff0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_780;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar65 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_0071cc02;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 9) {
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x18] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x19] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x1a] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_1608 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,9,3,1,9,3>>(&local_340,a_lhs,&local_ff0,&local_1608);
          pdVar64 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x1b) {
            if (pdVar64 != (double *)0x0) {
              free((void *)pdVar64[-1]);
            }
            pvVar60 = malloc(0x118);
            if (pvVar60 == (void *)0x0) {
              puVar63 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar63 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar63,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            *(void **)(((ulong)pvVar60 & 0xffffffffffffffc0) + 0x38) = pvVar60;
            pdVar64 = (double *)(((ulong)pvVar60 & 0xffffffffffffffc0) + 0x40);
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar64;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x1b;
          }
          uVar61 = 0xfffffffffffffff8;
          do {
            dVar125 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar61 + 9];
            dVar129 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar61 + 10];
            dVar132 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar61 + 0xb];
            dVar133 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar61 + 0xc];
            dVar119 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar61 + 0xd];
            dVar6 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage
                    .m_data.array[uVar61 + 0xe];
            dVar7 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage
                    .m_data.array[uVar61 + 0xf];
            pdVar66 = pdVar64 + uVar61 + 8;
            *pdVar66 = local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                       m_storage.m_data.array[uVar61 + 8];
            pdVar66[1] = dVar125;
            pdVar66[2] = dVar129;
            pdVar66[3] = dVar132;
            pdVar66[4] = dVar133;
            pdVar66[5] = dVar119;
            pdVar66[6] = dVar6;
            pdVar66[7] = dVar7;
            uVar61 = uVar61 + 8;
          } while (uVar61 < 0x10);
          lVar62 = 0x18;
          do {
            pdVar64[lVar62] =
                 local_340.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
                 m_data.array[lVar62];
            lVar62 = lVar62 + 1;
          } while (lVar62 != 0x1b);
          return;
        }
        pcVar65 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 3, 1>]"
        ;
        goto LAB_0071cc24;
      }
      pcVar65 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar65 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar65);
  }
  pcVar65 = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 6, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 6, 0>]"
  ;
LAB_0071cc24:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar65);
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For this element, this is likely more efficient than the "Pre-Integration" style calculation method.  Note that
    // the integrand for the generalize internal force vector for a straight and normalized element is of order : 8 in
    // xi, 4 in eta, and 4 in zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and
    // zeta directions for "Full Integration". However, very similar results can be obtained with fewer GQ point in each
    // direction, resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff can be calculated by
    // simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding diagonal entry
    // in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Block entries will be calculated separately in a later step.
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // Note that with the material assumption being used, only [E11,E22,E33] need to be calculated
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 Block entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}